

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall CLayerGroup::GetSize(CLayerGroup *this,float *w,float *h)

{
  CLayer *pCVar1;
  long lVar2;
  long in_FS_OFFSET;
  float fVar3;
  float lh;
  float lw;
  float local_40;
  float local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *w = 0.0;
  *h = 0.0;
  if (0 < (this->m_lLayers).num_elements) {
    lVar2 = 0;
    do {
      pCVar1 = (this->m_lLayers).list[lVar2];
      (*pCVar1->_vptr_CLayer[0xe])(pCVar1,&local_3c,&local_40);
      fVar3 = *w;
      if (*w <= local_3c) {
        fVar3 = local_3c;
      }
      *w = fVar3;
      fVar3 = *h;
      if (*h <= local_40) {
        fVar3 = local_40;
      }
      *h = fVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->m_lLayers).num_elements);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CLayerGroup::GetSize(float *w, float *h) const
{
	*w = 0; *h = 0;
	for(int i = 0; i < m_lLayers.size(); i++)
	{
		float lw, lh;
		m_lLayers[i]->GetSize(&lw, &lh);
		*w = maximum(*w, lw);
		*h = maximum(*h, lh);
	}
}